

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ring_structs.c
# Opt level: O1

ulp_ring_private_key * ulp_ring_alloc_private_key(size_t n)

{
  ulp_ring_private_key *__ptr;
  uint64_t *puVar1;
  
  __ptr = (ulp_ring_private_key *)malloc(0x18);
  if (__ptr != (ulp_ring_private_key *)0x0) {
    __ptr->n = n;
    puVar1 = (uint64_t *)malloc(n << 3);
    __ptr->s = puVar1;
    if (puVar1 != (uint64_t *)0x0) {
      return __ptr;
    }
    free(__ptr);
  }
  return (ulp_ring_private_key *)0x0;
}

Assistant:

ulp_ring_private_key* ulp_ring_alloc_private_key(size_t n) {
    ulp_ring_private_key* key = malloc(sizeof(ulp_ring_private_key));
    if(key == NULL)
        return NULL;
    key->n = n;
    key->s = malloc(n*sizeof(key->q));
    if(key->s == NULL) {
        free(key);
        return NULL;
    }
    return key;
}